

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O0

void mk_vhost_init(char *path,mk_server *server)

{
  undefined8 uVar1;
  int iVar2;
  mk_vhost *pmVar3;
  size_t sVar4;
  undefined1 local_70 [4];
  int ret;
  file_info f_info;
  dirent *ent;
  mk_vhost *p_host;
  char *file;
  char *sites;
  char *buf;
  unsigned_long len;
  DIR *dir;
  mk_server *server_local;
  char *path_local;
  
  sites = (char *)0x0;
  file = (char *)0x0;
  dir = (DIR *)server;
  server_local = (mk_server *)path;
  if (server->conf_sites == (char *)0x0) {
    mk_print(0x1002,"[vhost] skipping default site");
  }
  else {
    mk_string_build(&file,(unsigned_long *)&buf,"%s/%s/",path,server->conf_sites);
    iVar2 = mk_file_get_info(file,(file_info *)local_70,1);
    if ((iVar2 == -1) || (f_info.last_modification._7_1_ == '\0')) {
      mk_mem_free(file);
      file = *(char **)(dir + 0x40);
    }
    mk_string_build(&sites,(unsigned_long *)&buf,"%s/default",file);
    pmVar3 = mk_vhost_read(sites);
    if (pmVar3 == (mk_vhost *)0x0) {
      mk_print(0x1001,"Error parsing main configuration file \'default\'");
    }
    mk_list_add(&pmVar3->_head,(mk_list *)(dir + 0xd8));
    *(int *)(dir + 0xd0) = *(int *)(dir + 0xd0) + 1;
    mk_mem_free(sites);
    sites = (char *)0x0;
    len = (unsigned_long)opendir(file);
    if ((DIR *)len == (DIR *)0x0) {
      mk_mem_free(file);
      mk_print(0x1001,"Could not open %s",file);
      exit(1);
    }
    while (f_info._24_8_ = readdir((DIR *)len), (dirent *)f_info._24_8_ != (dirent *)0x0) {
      if ((((((dirent *)f_info._24_8_)->d_name[0] != '.') &&
           (iVar2 = strcmp(((dirent *)f_info._24_8_)->d_name,".."), uVar1 = f_info._24_8_,
           iVar2 != 0)) &&
          (sVar4 = strlen((char *)(f_info._24_8_ + 0x13)), *(char *)(uVar1 + sVar4 + 0x12) != '~'))
         && (iVar2 = strcasecmp((char *)(f_info._24_8_ + 0x13),"default"), iVar2 != 0)) {
        p_host = (mk_vhost *)0x0;
        mk_string_build((char **)&p_host,(unsigned_long *)&buf,"%s/%s",file,f_info._24_8_ + 0x13);
        pmVar3 = mk_vhost_read((char *)p_host);
        mk_mem_free(p_host);
        if (pmVar3 != (mk_vhost *)0x0) {
          mk_list_add(&pmVar3->_head,(mk_list *)(dir + 0xd8));
          *(int *)(dir + 0xd0) = *(int *)(dir + 0xd0) + 1;
        }
      }
    }
    closedir((DIR *)len);
    mk_mem_free(file);
  }
  return;
}

Assistant:

void mk_vhost_init(char *path, struct mk_server *server)
{
    DIR *dir;
    unsigned long len;
    char *buf = 0;
    char *sites = 0;
    char *file;
    struct mk_vhost *p_host;     /* debug */
    struct dirent *ent;
    struct file_info f_info;
    int ret;

    if (!server->conf_sites) {
        mk_warn("[vhost] skipping default site");
        return;
    }

    /* Read default virtual host file */
    mk_string_build(&sites, &len, "%s/%s/",
                    path, server->conf_sites);
    ret = mk_file_get_info(sites, &f_info, MK_FILE_EXISTS);
    if (ret == -1 || f_info.is_directory == MK_FALSE) {
        mk_mem_free(sites);
        sites = server->conf_sites;
    }

    mk_string_build(&buf, &len, "%s/default", sites);

    p_host = mk_vhost_read(buf);
    if (!p_host) {
        mk_err("Error parsing main configuration file 'default'");
    }
    mk_list_add(&p_host->_head, &server->hosts);
    server->nhosts++;
    mk_mem_free(buf);
    buf = NULL;


    /* Read all virtual hosts defined in sites/ */
    if (!(dir = opendir(sites))) {
        mk_mem_free(sites);
        mk_err("Could not open %s", sites);
        exit(EXIT_FAILURE);
    }

    /* Reading content */
    while ((ent = readdir(dir)) != NULL) {
        if (ent->d_name[0] == '.') {
            continue;
        }
        if (strcmp((char *) ent->d_name, "..") == 0) {
            continue;
        }
        if (ent->d_name[strlen(ent->d_name) - 1] ==  '~') {
            continue;
        }
        if (strcasecmp((char *) ent->d_name, "default") == 0) {
            continue;
        }
        file = NULL;
        mk_string_build(&file, &len, "%s/%s", sites, ent->d_name);

        p_host = mk_vhost_read(file);
        mk_mem_free(file);
        if (!p_host) {
            continue;
        }
        else {
            mk_list_add(&p_host->_head, &server->hosts);
            server->nhosts++;
        }
    }
    closedir(dir);
    mk_mem_free(sites);
}